

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::summarycalc(summarycalc *this)

{
  summarycalc *this_local;
  
  this->min_summary_id_[8] = 0x7fffffff;
  this->min_summary_id_[9] = 0x7fffffff;
  this->min_summary_id_[4] = 0x7fffffff;
  this->min_summary_id_[5] = 0x7fffffff;
  this->min_summary_id_[6] = 0x7fffffff;
  this->min_summary_id_[7] = 0x7fffffff;
  this->min_summary_id_[0] = 0x7fffffff;
  this->min_summary_id_[1] = 0x7fffffff;
  this->min_summary_id_[2] = 0x7fffffff;
  this->min_summary_id_[3] = 0x7fffffff;
  this->max_summary_id_[4] = -1;
  this->max_summary_id_[5] = -1;
  this->max_summary_id_[6] = -1;
  this->max_summary_id_[7] = -1;
  this->max_summary_id_[0] = -1;
  this->max_summary_id_[1] = -1;
  this->max_summary_id_[2] = -1;
  this->max_summary_id_[3] = -1;
  this->max_summary_id_[8] = -1;
  this->max_summary_id_[9] = -1;
  this->fout[8] = (FILE *)0x0;
  this->fout[9] = (FILE *)0x0;
  this->fout[6] = (FILE *)0x0;
  this->fout[7] = (FILE *)0x0;
  this->fout[4] = (FILE *)0x0;
  this->fout[5] = (FILE *)0x0;
  this->fout[2] = (FILE *)0x0;
  this->fout[3] = (FILE *)0x0;
  this->fout[0] = (FILE *)0x0;
  this->fout[1] = (FILE *)0x0;
  this->idxout[8] = (FILE *)0x0;
  this->idxout[9] = (FILE *)0x0;
  this->idxout[6] = (FILE *)0x0;
  this->idxout[7] = (FILE *)0x0;
  this->idxout[4] = (FILE *)0x0;
  this->idxout[5] = (FILE *)0x0;
  this->idxout[2] = (FILE *)0x0;
  this->idxout[3] = (FILE *)0x0;
  this->idxout[0] = (FILE *)0x0;
  this->idxout[1] = (FILE *)0x0;
  this->co_to_s_[8] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->co_to_s_[9] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->co_to_s_[6] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->co_to_s_[7] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->co_to_s_[4] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->co_to_s_[5] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->co_to_s_[2] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->co_to_s_[3] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->co_to_s_[0] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->co_to_s_[1] = (coverage_id_or_output_id_to_Summary_id *)0x0;
  this->sssl[8] = (OASIS_FLOAT **)0x0;
  this->sssl[9] = (OASIS_FLOAT **)0x0;
  this->sssl[6] = (OASIS_FLOAT **)0x0;
  this->sssl[7] = (OASIS_FLOAT **)0x0;
  this->sssl[4] = (OASIS_FLOAT **)0x0;
  this->sssl[5] = (OASIS_FLOAT **)0x0;
  this->sssl[2] = (OASIS_FLOAT **)0x0;
  this->sssl[3] = (OASIS_FLOAT **)0x0;
  this->sssl[0] = (OASIS_FLOAT **)0x0;
  this->sssl[1] = (OASIS_FLOAT **)0x0;
  this->sse[8] = (OASIS_FLOAT *)0x0;
  this->sse[9] = (OASIS_FLOAT *)0x0;
  this->sse[6] = (OASIS_FLOAT *)0x0;
  this->sse[7] = (OASIS_FLOAT *)0x0;
  this->sse[4] = (OASIS_FLOAT *)0x0;
  this->sse[5] = (OASIS_FLOAT *)0x0;
  this->sse[2] = (OASIS_FLOAT *)0x0;
  this->sse[3] = (OASIS_FLOAT *)0x0;
  this->sse[0] = (OASIS_FLOAT *)0x0;
  this->sse[1] = (OASIS_FLOAT *)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&this->foutIndex_);
  std::vector<float,_std::allocator<float>_>::vector(&this->coverages_);
  std::vector<float,_std::allocator<float>_>::vector(&this->outputs_);
  std::vector<int,_std::allocator<int>_>::vector(&this->item_to_coverage_);
  this->inputtype_ = UNKNOWN;
  std::__cxx11::string::string((string *)&this->inputpath_);
  this->zerooutput_ = false;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->indexFiles);
  this->offset_[8] = 0;
  this->offset_[9] = 0;
  this->offset_[6] = 0;
  this->offset_[7] = 0;
  this->offset_[4] = 0;
  this->offset_[5] = 0;
  this->offset_[2] = 0;
  this->offset_[3] = 0;
  this->offset_[0] = 0;
  this->offset_[1] = 0;
  this->num_idx_ = 5;
  this->first_idx_ = 2;
  this->last_event_id_ = -1;
  this->last_item_id_ = -1;
  freopen((char *)0x0,"rb",_stdin);
  freopen((char *)0x0,"wb",_stdout);
  return;
}

Assistant:

summarycalc::summarycalc()
{

#if defined(_MSC_VER) || defined(__MINGW32__)
	_setmode(_fileno(stdout), O_BINARY);
	_setmode(_fileno(stdin), O_BINARY);
#else
	freopen(NULL, "rb", stdin);
	freopen(NULL, "wb", stdout);
#endif

}